

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cpp
# Opt level: O3

shared_ptr<index_tree> __thiscall dfa::get_index_tree(dfa *this,wchar_t key)

{
  size_type sVar1;
  iterator iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<index_tree> sVar3;
  key_type local_c;
  
  iVar2 = std::
          _Hashtable<wchar_t,_std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<wchar_t,_std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)CONCAT44(in_register_00000034,key),&local_c);
  if (iVar2.super__Node_iterator_base<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    (this->index_trees_)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->index_trees_)._M_h._M_bucket_count = 0;
  }
  else {
    (this->index_trees_)._M_h._M_buckets =
         *(__buckets_ptr *)
          ((long)iVar2.
                 super__Node_iterator_base<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false>
                 ._M_cur + 0x10);
    sVar1 = *(size_type *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false>
                    ._M_cur + 0x18);
    (this->index_trees_)._M_h._M_bucket_count = sVar1;
    if (sVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
      }
    }
  }
  sVar3.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<index_tree>)sVar3.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<index_tree> dfa::get_index_tree(wchar_t key)
{
    auto iter = index_trees_.find(key);
    if (iter != index_trees_.end())
    {
        return iter->second;
    }
    return nullptr;
}